

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# runner-unix.c
# Opt level: O3

void * dowait(void *data)

{
  long lVar1;
  int iVar2;
  __pid_t _Var3;
  ssize_t sVar4;
  int *piVar5;
  long lVar6;
  long lVar7;
  
  iVar2 = *(int *)((long)data + 0x10);
  if (0 < iVar2) {
    lVar6 = 0x18;
    lVar7 = 0;
    do {
      lVar1 = *(long *)((long)data + 8);
      if (*(int *)(lVar1 + 4 + lVar6) == 0) {
        _Var3 = waitpid(*(__pid_t *)(lVar1 + -0x10 + lVar6),(int *)(lVar1 + lVar6),0);
        if (_Var3 < 0) {
          perror("waitpid");
          return (void *)0x0;
        }
        *(undefined4 *)(lVar1 + 4 + lVar6) = 1;
        iVar2 = *(int *)((long)data + 0x10);
      }
      lVar7 = lVar7 + 1;
      lVar6 = lVar6 + 0x400;
    } while (lVar7 < iVar2);
  }
  if (-1 < *(int *)((long)data + 4)) {
    do {
      sVar4 = write(*(int *)((long)data + 4),"",1);
      if (sVar4 != -1) {
        return (void *)0x0;
      }
      piVar5 = __errno_location();
    } while (*piVar5 == 4);
  }
  return (void *)0x0;
}

Assistant:

static void* dowait(void* data) {
  dowait_args* args = data;

  int i, r;
  process_info_t* p;

  for (i = 0; i < args->n; i++) {
    p = (process_info_t*)(args->vec + i * sizeof(process_info_t));
    if (p->terminated) continue;
    r = waitpid(p->pid, &p->status, 0);
    if (r < 0) {
      perror("waitpid");
      return NULL;
    }
    p->terminated = 1;
  }

  if (args->pipe[1] >= 0) {
    /* Write a character to the main thread to notify it about this. */
    ssize_t r;

    do
      r = write(args->pipe[1], "", 1);
    while (r == -1 && errno == EINTR);
  }

  return NULL;
}